

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alrecord.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *pFVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  undefined8 uVar5;
  int *piVar6;
  void *pvVar7;
  size_t sVar8;
  undefined8 *in_RSI;
  int in_EDI;
  char *pcVar9;
  char *pcVar10;
  bool bVar11;
  ALbyte *data;
  ALCint count;
  char *end;
  ALCenum err;
  ALenum format;
  long total_size;
  Recorder recorder;
  char *progname;
  char *devname;
  char *fname;
  undefined4 in_stack_fffffffffffffef8;
  uint uVar12;
  undefined4 in_stack_fffffffffffffefc;
  undefined8 in_stack_ffffffffffffff00;
  ALuint AVar13;
  char *local_b8;
  char *local_a8;
  uint local_8c;
  char *local_88;
  uint local_80;
  undefined4 local_7c;
  long local_78;
  long local_70;
  FILE *local_68;
  long local_60;
  uint local_58;
  float local_54;
  int local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  void *local_40;
  uint local_38;
  undefined8 local_30;
  char *local_28;
  char *local_20;
  undefined8 *local_18;
  int local_10;
  int local_c;
  
  local_c = 0;
  local_20 = "record.wav";
  local_28 = (char *)0x0;
  local_30 = *in_RSI;
  if (in_EDI < 2) {
    fprintf(_stderr,
            "Record from a device to a wav file.\n\nUsage: %s [-device <name>] [options...]\n\nAvailable options:\n%s\n"
            ,local_30,
            "    --channels/-c <channels>  Set channel count (1 or 2)\n    --bits/-b <bits>          Set channel count (8, 16, or 32)\n    --rate/-r <rate>          Set sample rate (8000 to 96000)\n    --time/-t <time>          Time in seconds to record (1 to 10)\n    --outfile/-o <filename>   Output filename (default: record.wav)"
           );
    local_c = 0;
  }
  else {
    local_70 = 0;
    local_68 = (FILE *)0x0;
    local_60 = 0;
    local_58 = 0;
    local_54 = 4.0;
    local_50 = 1;
    local_4c = 0x10;
    local_48 = 0xac44;
    local_44 = 2;
    local_40 = (void *)0x0;
    local_38 = 0;
    local_18 = in_RSI + 1;
    local_10 = in_EDI + -1;
    if ((1 < local_10) && (iVar3 = strcmp((char *)*local_18,"-device"), iVar3 == 0)) {
      local_28 = (char *)local_18[1];
      local_18 = local_18 + 2;
      local_10 = local_10 + -2;
    }
    for (; AVar13 = (ALuint)((ulong)in_stack_ffffffffffffff00 >> 0x20), 0 < local_10;
        local_10 = local_10 + -2) {
      iVar3 = strcmp((char *)*local_18,"--");
      AVar13 = (ALuint)((ulong)in_stack_ffffffffffffff00 >> 0x20);
      if (iVar3 == 0) break;
      iVar3 = strcmp((char *)*local_18,"--channels");
      if ((iVar3 == 0) || (iVar3 = strcmp((char *)*local_18,"-c"), iVar3 == 0)) {
        if (local_10 < 2) {
          fprintf(_stderr,"Missing argument for option: %s\n",*local_18);
          return 1;
        }
        uVar4 = strtoul((char *)local_18[1],&local_88,0);
        local_50 = (int)uVar4;
        if (((local_50 != 1) && (local_50 != 2)) ||
           ((local_88 != (char *)0x0 && (*local_88 != '\0')))) {
          fprintf(_stderr,"Invalid channels: %s\n",local_18[1]);
          return 1;
        }
      }
      else {
        iVar3 = strcmp((char *)*local_18,"--bits");
        if ((iVar3 == 0) || (iVar3 = strcmp((char *)*local_18,"-b"), iVar3 == 0)) {
          if (local_10 < 2) {
            fprintf(_stderr,"Missing argument for option: %s\n",*local_18);
            return 1;
          }
          uVar4 = strtoul((char *)local_18[1],&local_88,0);
          local_4c = (uint)uVar4;
          if ((((local_4c != 8) && (local_4c != 0x10)) && (local_4c != 0x20)) ||
             ((local_88 != (char *)0x0 && (*local_88 != '\0')))) {
            fprintf(_stderr,"Invalid bit count: %s\n",local_18[1]);
            return 1;
          }
        }
        else {
          iVar3 = strcmp((char *)*local_18,"--rate");
          if ((iVar3 == 0) || (iVar3 = strcmp((char *)*local_18,"-r"), iVar3 == 0)) {
            if (local_10 < 2) {
              fprintf(_stderr,"Missing argument for option: %s\n",*local_18);
              return 1;
            }
            uVar4 = strtoul((char *)local_18[1],&local_88,0);
            local_48 = (uint)uVar4;
            if (((local_48 < 8000) || (96000 < local_48)) ||
               ((local_88 != (char *)0x0 && (*local_88 != '\0')))) {
              fprintf(_stderr,"Invalid sample rate: %s\n",local_18[1]);
              return 1;
            }
          }
          else {
            iVar3 = strcmp((char *)*local_18,"--time");
            if ((iVar3 == 0) || (iVar3 = strcmp((char *)*local_18,"-t"), iVar3 == 0)) {
              if (local_10 < 2) {
                fprintf(_stderr,"Missing argument for option: %s\n",*local_18);
                return 1;
              }
              local_54 = strtof((char *)local_18[1],&local_88);
              if (((local_54 < 1.0) || (10.0 < local_54)) ||
                 ((local_88 != (char *)0x0 && (*local_88 != '\0')))) {
                fprintf(_stderr,"Invalid record time: %s\n",local_18[1]);
                return 1;
              }
            }
            else {
              iVar3 = strcmp((char *)*local_18,"--outfile");
              if ((iVar3 != 0) && (iVar3 = strcmp((char *)*local_18,"-o"), iVar3 != 0)) {
                iVar3 = strcmp((char *)*local_18,"--help");
                if ((iVar3 != 0) && (iVar3 = strcmp((char *)*local_18,"-h"), iVar3 != 0)) {
                  fprintf(_stderr,
                          "Invalid option \'%s\'.\n\nUsage: %s [-device <name>] [options...]\n\nAvailable options:\n%s\n"
                          ,*local_18,local_30,
                          "    --channels/-c <channels>  Set channel count (1 or 2)\n    --bits/-b <bits>          Set channel count (8, 16, or 32)\n    --rate/-r <rate>          Set sample rate (8000 to 96000)\n    --time/-t <time>          Time in seconds to record (1 to 10)\n    --outfile/-o <filename>   Output filename (default: record.wav)"
                         );
                  return 0;
                }
                fprintf(_stderr,
                        "Record from a device to a wav file.\n\nUsage: %s [-device <name>] [options...]\n\nAvailable options:\n%s\n"
                        ,local_30,
                        "    --channels/-c <channels>  Set channel count (1 or 2)\n    --bits/-b <bits>          Set channel count (8, 16, or 32)\n    --rate/-r <rate>          Set sample rate (8000 to 96000)\n    --time/-t <time>          Time in seconds to record (1 to 10)\n    --outfile/-o <filename>   Output filename (default: record.wav)"
                       );
                return 0;
              }
              if (local_10 < 2) {
                fprintf(_stderr,"Missing argument for option: %s\n",*local_18);
                return 1;
              }
              local_20 = (char *)local_18[1];
            }
          }
        }
      }
      local_18 = local_18 + 2;
    }
    local_44 = local_50 * local_4c >> 3;
    local_7c = 0;
    if (local_50 == 1) {
      if (local_4c == 8) {
        local_7c = 0x1100;
      }
      else if (local_4c == 0x10) {
        local_7c = 0x1101;
      }
      else if (local_4c == 0x20) {
        local_7c = 0x10010;
      }
    }
    else if (local_50 == 2) {
      if (local_4c == 8) {
        local_7c = 0x1102;
      }
      else if (local_4c == 0x10) {
        local_7c = 0x1103;
      }
      else if (local_4c == 0x20) {
        local_7c = 0x10011;
      }
    }
    local_70 = alcCaptureOpenDevice(local_28,local_48,local_7c,0x8000);
    pFVar1 = _stderr;
    if (local_70 == 0) {
      if (local_28 == (char *)0x0) {
        local_a8 = "default device";
      }
      else {
        local_a8 = local_28;
      }
      if (local_4c == 0x20) {
        local_b8 = "Float";
      }
      else {
        local_b8 = "Unsigned";
        if (local_4c != 8) {
          local_b8 = "Signed";
        }
      }
      pcVar9 = "Stereo";
      if (local_50 == 1) {
        pcVar9 = "Mono";
      }
      fprintf(_stderr,"Failed to open %s, %s %d-bit, %s, %dhz (%d samples)\n",local_a8,local_b8,
              (ulong)local_4c,pcVar9,local_48,CONCAT44(AVar13,0x8000));
      local_c = 1;
    }
    else {
      uVar5 = alcGetString(local_70,0x310);
      fprintf(pFVar1,"Opened \"%s\"\n",uVar5);
      local_68 = fopen(local_20,"wb");
      if (local_68 == (FILE *)0x0) {
        fprintf(_stderr,"Failed to open \'%s\' for writing\n",local_20);
        alcCaptureCloseDevice(local_70);
        local_c = 1;
      }
      else {
        fputs("RIFF",local_68);
        fwrite32le(AVar13,(FILE *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        fputs("WAVE",local_68);
        fputs("fmt ",local_68);
        fwrite32le(AVar13,(FILE *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        fwrite16le((ALushort)(AVar13 >> 0x10),
                   (FILE *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        fwrite16le((ALushort)(AVar13 >> 0x10),
                   (FILE *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        fwrite32le(AVar13,(FILE *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        fwrite32le(AVar13,(FILE *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        fwrite16le((ALushort)(AVar13 >> 0x10),
                   (FILE *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        fwrite16le((ALushort)(AVar13 >> 0x10),
                   (FILE *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        fwrite16le((ALushort)(AVar13 >> 0x10),
                   (FILE *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        fputs("data",local_68);
        fwrite32le(AVar13,(FILE *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        local_60 = ftell(local_68);
        local_60 = local_60 + -4;
        iVar3 = ferror(local_68);
        pFVar1 = _stderr;
        if ((iVar3 == 0) && (-1 < local_60)) {
          if (local_4c == 0x20) {
            pcVar9 = "Float";
          }
          else {
            pcVar9 = "Unsigned";
            if (local_4c != 8) {
              pcVar9 = "Signed";
            }
          }
          pcVar10 = "Stereo";
          if (local_50 == 1) {
            pcVar10 = "Mono";
          }
          uVar5 = 0;
          uVar12 = local_48;
          fprintf(_stderr,"Recording \'%s\', %s %d-bit, %s, %dhz (%g second%s)\n",(double)local_54,
                  local_20,pcVar9,(ulong)local_4c,pcVar10);
          local_80 = 0;
          alcCaptureStart(local_70);
          while( true ) {
            bVar11 = false;
            if ((double)local_58 / (double)local_48 < (double)local_54) {
              local_80 = alcGetError(local_70);
              bVar11 = false;
              if (local_80 == 0) {
                iVar3 = ferror(local_68);
                bVar11 = iVar3 == 0;
              }
            }
            AVar13 = (ALuint)((ulong)uVar5 >> 0x20);
            if (!bVar11) break;
            local_8c = 0;
            fprintf(_stderr,"\rCaptured %u samples",(ulong)local_58);
            alcGetIntegerv(local_70,0x312,1,&local_8c);
            if ((int)local_8c < 1) {
              al_nssleep((unsigned_long)pcVar9);
            }
            else {
              if ((int)local_38 < (int)local_8c) {
                pvVar7 = calloc((ulong)local_44,(ulong)local_8c);
                free(local_40);
                local_38 = local_8c;
                local_40 = pvVar7;
              }
              alcCaptureSamples(local_70,local_40,local_8c);
              sVar8 = fwrite(local_40,(ulong)local_44,(ulong)local_8c,local_68);
              local_58 = (int)sVar8 + local_58;
            }
          }
          alcCaptureStop(local_70);
          fprintf(_stderr,"\rCaptured %u samples\n",(ulong)local_58);
          uVar2 = local_80;
          pFVar1 = _stderr;
          if (local_80 != 0) {
            uVar5 = alcGetString(local_70,local_80);
            fprintf(pFVar1,"Got device error 0x%04x: %s\n",(ulong)uVar2,uVar5);
          }
          alcCaptureCloseDevice(local_70);
          local_70 = 0;
          free(local_40);
          local_40 = (void *)0x0;
          local_38 = 0;
          local_78 = ftell(local_68);
          iVar3 = fseek(local_68,local_60,0);
          if (iVar3 == 0) {
            fwrite32le(AVar13,(FILE *)CONCAT44(in_stack_fffffffffffffefc,uVar12));
            iVar3 = fseek(local_68,4,0);
            if (iVar3 == 0) {
              fwrite32le(AVar13,(FILE *)CONCAT44(in_stack_fffffffffffffefc,uVar12));
            }
          }
          fclose(local_68);
          local_c = 0;
        }
        else {
          piVar6 = __errno_location();
          pcVar9 = strerror(*piVar6);
          fprintf(pFVar1,"Error writing header: %s\n",pcVar9);
          fclose(local_68);
          alcCaptureCloseDevice(local_70);
          local_c = 1;
        }
      }
    }
  }
  return local_c;
}

Assistant:

int main(int argc, char **argv)
{
    static const char optlist[] =
"    --channels/-c <channels>  Set channel count (1 or 2)\n"
"    --bits/-b <bits>          Set channel count (8, 16, or 32)\n"
"    --rate/-r <rate>          Set sample rate (8000 to 96000)\n"
"    --time/-t <time>          Time in seconds to record (1 to 10)\n"
"    --outfile/-o <filename>   Output filename (default: record.wav)";
    const char *fname = "record.wav";
    const char *devname = NULL;
    const char *progname;
    Recorder recorder;
    long total_size;
    ALenum format;
    ALCenum err;

    progname = argv[0];
    if(argc < 2)
    {
        fprintf(stderr, "Record from a device to a wav file.\n\n"
                "Usage: %s [-device <name>] [options...]\n\n"
                "Available options:\n%s\n", progname, optlist);
        return 0;
    }

    recorder.mDevice = NULL;
    recorder.mFile = NULL;
    recorder.mDataSizeOffset = 0;
    recorder.mDataSize = 0;
    recorder.mRecTime = 4.0f;
    recorder.mChannels = 1;
    recorder.mBits = 16;
    recorder.mSampleRate = 44100;
    recorder.mFrameSize = recorder.mChannels * recorder.mBits / 8;
    recorder.mBuffer = NULL;
    recorder.mBufferSize = 0;

    argv++; argc--;
    if(argc > 1 && strcmp(argv[0], "-device") == 0)
    {
        devname = argv[1];
        argv += 2;
        argc -= 2;
    }

    while(argc > 0)
    {
        char *end;
        if(strcmp(argv[0], "--") == 0)
            break;
        else if(strcmp(argv[0], "--channels") == 0 || strcmp(argv[0], "-c") == 0)
        {
            if(argc < 2)
            {
                fprintf(stderr, "Missing argument for option: %s\n", argv[0]);
                return 1;
            }

            recorder.mChannels = (ALuint)strtoul(argv[1], &end, 0);
            if((recorder.mChannels != 1 && recorder.mChannels != 2) || (end && *end != '\0'))
            {
                fprintf(stderr, "Invalid channels: %s\n", argv[1]);
                return 1;
            }
            argv += 2;
            argc -= 2;
        }
        else if(strcmp(argv[0], "--bits") == 0 || strcmp(argv[0], "-b") == 0)
        {
            if(argc < 2)
            {
                fprintf(stderr, "Missing argument for option: %s\n", argv[0]);
                return 1;
            }

            recorder.mBits = (ALuint)strtoul(argv[1], &end, 0);
            if((recorder.mBits != 8 && recorder.mBits != 16 && recorder.mBits != 32) ||
               (end && *end != '\0'))
            {
                fprintf(stderr, "Invalid bit count: %s\n", argv[1]);
                return 1;
            }
            argv += 2;
            argc -= 2;
        }
        else if(strcmp(argv[0], "--rate") == 0 || strcmp(argv[0], "-r") == 0)
        {
            if(argc < 2)
            {
                fprintf(stderr, "Missing argument for option: %s\n", argv[0]);
                return 1;
            }

            recorder.mSampleRate = (ALuint)strtoul(argv[1], &end, 0);
            if(!(recorder.mSampleRate >= 8000 && recorder.mSampleRate <= 96000) || (end && *end != '\0'))
            {
                fprintf(stderr, "Invalid sample rate: %s\n", argv[1]);
                return 1;
            }
            argv += 2;
            argc -= 2;
        }
        else if(strcmp(argv[0], "--time") == 0 || strcmp(argv[0], "-t") == 0)
        {
            if(argc < 2)
            {
                fprintf(stderr, "Missing argument for option: %s\n", argv[0]);
                return 1;
            }

            recorder.mRecTime = strtof(argv[1], &end);
            if(!(recorder.mRecTime >= 1.0f && recorder.mRecTime <= 10.0f) || (end && *end != '\0'))
            {
                fprintf(stderr, "Invalid record time: %s\n", argv[1]);
                return 1;
            }
            argv += 2;
            argc -= 2;
        }
        else if(strcmp(argv[0], "--outfile") == 0 || strcmp(argv[0], "-o") == 0)
        {
            if(argc < 2)
            {
                fprintf(stderr, "Missing argument for option: %s\n", argv[0]);
                return 1;
            }

            fname = argv[1];
            argv += 2;
            argc -= 2;
        }
        else if(strcmp(argv[0], "--help") == 0 || strcmp(argv[0], "-h") == 0)
        {
            fprintf(stderr, "Record from a device to a wav file.\n\n"
                    "Usage: %s [-device <name>] [options...]\n\n"
                    "Available options:\n%s\n", progname, optlist);
            return 0;
        }
        else
        {
            fprintf(stderr, "Invalid option '%s'.\n\n"
                    "Usage: %s [-device <name>] [options...]\n\n"
                    "Available options:\n%s\n", argv[0], progname, optlist);
            return 0;
        }
    }

    recorder.mFrameSize = recorder.mChannels * recorder.mBits / 8;

    format = AL_NONE;
    if(recorder.mChannels == 1)
    {
        if(recorder.mBits == 8)
            format = AL_FORMAT_MONO8;
        else if(recorder.mBits == 16)
            format = AL_FORMAT_MONO16;
        else if(recorder.mBits == 32)
            format = AL_FORMAT_MONO_FLOAT32;
    }
    else if(recorder.mChannels == 2)
    {
        if(recorder.mBits == 8)
            format = AL_FORMAT_STEREO8;
        else if(recorder.mBits == 16)
            format = AL_FORMAT_STEREO16;
        else if(recorder.mBits == 32)
            format = AL_FORMAT_STEREO_FLOAT32;
    }

    recorder.mDevice = alcCaptureOpenDevice(devname, recorder.mSampleRate, format, 32768);
    if(!recorder.mDevice)
    {
        fprintf(stderr, "Failed to open %s, %s %d-bit, %s, %dhz (%d samples)\n",
            devname ? devname : "default device",
            (recorder.mBits == 32) ? "Float" :
            (recorder.mBits !=  8) ? "Signed" : "Unsigned", recorder.mBits,
            (recorder.mChannels == 1) ? "Mono" : "Stereo", recorder.mSampleRate,
            32768
        );
        return 1;
    }
    fprintf(stderr, "Opened \"%s\"\n", alcGetString(
        recorder.mDevice, ALC_CAPTURE_DEVICE_SPECIFIER
    ));

    recorder.mFile = fopen(fname, "wb");
    if(!recorder.mFile)
    {
        fprintf(stderr, "Failed to open '%s' for writing\n", fname);
        alcCaptureCloseDevice(recorder.mDevice);
        return 1;
    }

    fputs("RIFF", recorder.mFile);
    fwrite32le(0xFFFFFFFF, recorder.mFile); // 'RIFF' header len; filled in at close

    fputs("WAVE", recorder.mFile);

    fputs("fmt ", recorder.mFile);
    fwrite32le(18, recorder.mFile); // 'fmt ' header len

    // 16-bit val, format type id (1 = integer PCM, 3 = float PCM)
    fwrite16le((recorder.mBits == 32) ? 0x0003 : 0x0001, recorder.mFile);
    // 16-bit val, channel count
    fwrite16le((ALushort)recorder.mChannels, recorder.mFile);
    // 32-bit val, frequency
    fwrite32le(recorder.mSampleRate, recorder.mFile);
    // 32-bit val, bytes per second
    fwrite32le(recorder.mSampleRate * recorder.mFrameSize, recorder.mFile);
    // 16-bit val, frame size
    fwrite16le((ALushort)recorder.mFrameSize, recorder.mFile);
    // 16-bit val, bits per sample
    fwrite16le((ALushort)recorder.mBits, recorder.mFile);
    // 16-bit val, extra byte count
    fwrite16le(0, recorder.mFile);

    fputs("data", recorder.mFile);
    fwrite32le(0xFFFFFFFF, recorder.mFile); // 'data' header len; filled in at close

    recorder.mDataSizeOffset = ftell(recorder.mFile) - 4;
    if(ferror(recorder.mFile) || recorder.mDataSizeOffset < 0)
    {
        fprintf(stderr, "Error writing header: %s\n", strerror(errno));
        fclose(recorder.mFile);
        alcCaptureCloseDevice(recorder.mDevice);
        return 1;
    }

    fprintf(stderr, "Recording '%s', %s %d-bit, %s, %dhz (%g second%s)\n", fname,
        (recorder.mBits == 32) ? "Float" :
        (recorder.mBits !=  8) ? "Signed" : "Unsigned", recorder.mBits,
        (recorder.mChannels == 1) ? "Mono" : "Stereo", recorder.mSampleRate,
        recorder.mRecTime, (recorder.mRecTime != 1.0f) ? "s" : ""
    );

    err = ALC_NO_ERROR;
    alcCaptureStart(recorder.mDevice);
    while((double)recorder.mDataSize/(double)recorder.mSampleRate < recorder.mRecTime &&
          (err=alcGetError(recorder.mDevice)) == ALC_NO_ERROR && !ferror(recorder.mFile))
    {
        ALCint count = 0;
        fprintf(stderr, "\rCaptured %u samples", recorder.mDataSize);
        alcGetIntegerv(recorder.mDevice, ALC_CAPTURE_SAMPLES, 1, &count);
        if(count < 1)
        {
            al_nssleep(10000000);
            continue;
        }
        if(count > recorder.mBufferSize)
        {
            ALbyte *data = calloc(recorder.mFrameSize, (ALuint)count);
            free(recorder.mBuffer);
            recorder.mBuffer = data;
            recorder.mBufferSize = count;
        }
        alcCaptureSamples(recorder.mDevice, recorder.mBuffer, count);
#if defined(__BYTE_ORDER) && __BYTE_ORDER == __BIG_ENDIAN
        /* Byteswap multibyte samples on big-endian systems (wav needs little-
         * endian, and OpenAL gives the system's native-endian).
         */
        if(recorder.mBits == 16)
        {
            ALCint i;
            for(i = 0;i < count*recorder.mChannels;i++)
            {
                ALbyte b = recorder.mBuffer[i*2 + 0];
                recorder.mBuffer[i*2 + 0] = recorder.mBuffer[i*2 + 1];
                recorder.mBuffer[i*2 + 1] = b;
            }
        }
        else if(recorder.mBits == 32)
        {
            ALCint i;
            for(i = 0;i < count*recorder.mChannels;i++)
            {
                ALbyte b0 = recorder.mBuffer[i*4 + 0];
                ALbyte b1 = recorder.mBuffer[i*4 + 1];
                recorder.mBuffer[i*4 + 0] = recorder.mBuffer[i*4 + 3];
                recorder.mBuffer[i*4 + 1] = recorder.mBuffer[i*4 + 2];
                recorder.mBuffer[i*4 + 2] = b1;
                recorder.mBuffer[i*4 + 3] = b0;
            }
        }
#endif
        recorder.mDataSize += (ALuint)fwrite(recorder.mBuffer, recorder.mFrameSize, (ALuint)count,
                                             recorder.mFile);
    }
    alcCaptureStop(recorder.mDevice);
    fprintf(stderr, "\rCaptured %u samples\n", recorder.mDataSize);
    if(err != ALC_NO_ERROR)
        fprintf(stderr, "Got device error 0x%04x: %s\n", err, alcGetString(recorder.mDevice, err));

    alcCaptureCloseDevice(recorder.mDevice);
    recorder.mDevice = NULL;

    free(recorder.mBuffer);
    recorder.mBuffer = NULL;
    recorder.mBufferSize = 0;

    total_size = ftell(recorder.mFile);
    if(fseek(recorder.mFile, recorder.mDataSizeOffset, SEEK_SET) == 0)
    {
        fwrite32le(recorder.mDataSize*recorder.mFrameSize, recorder.mFile);
        if(fseek(recorder.mFile, 4, SEEK_SET) == 0)
            fwrite32le((ALuint)total_size - 8, recorder.mFile);
    }

    fclose(recorder.mFile);
    recorder.mFile = NULL;

    return 0;
}